

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O0

int AF_AActor_A_Look(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                    VMReturn *ret,int numret)

{
  AActor *this;
  int iVar1;
  uint uVar2;
  int iVar3;
  AActor *pAVar4;
  bool bVar5;
  TObjPtr *local_a0;
  bool local_97;
  FSoundID local_94;
  FSoundID local_90;
  TFlags<ActorFlag2,_unsigned_int> local_8c;
  TFlags<ActorFlag4,_unsigned_int> local_88;
  TFlags<ActorFlag,_unsigned_int> local_84;
  TFlags<ActorFlag4,_unsigned_int> local_80;
  TFlags<ActorFlag,_unsigned_int> local_7c;
  TFlags<ActorFlag,_unsigned_int> local_78;
  TFlags<ActorFlag,_unsigned_int> local_74;
  Self local_70;
  FName local_6c;
  undefined1 local_68 [8];
  NActorIterator iterator;
  AActor *local_48;
  AActor *targ;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0x79e,"int AF_AActor_A_Look(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  bVar5 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar5 = true, (param->field_0).field_1.atag != 1)) {
    bVar5 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar5) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0x79e,"int AF_AActor_A_Look(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  this = *(AActor **)&param->field_0;
  local_97 = true;
  if (this != (AActor *)0x0) {
    local_97 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
  }
  if (local_97 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0x79e,"int AF_AActor_A_Look(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  iVar1 = (int)this;
  TFlags<ActorFlag5,_unsigned_int>::operator&
            ((TFlags<ActorFlag5,_unsigned_int> *)((long)&iterator.type + 4),
             iVar1 + (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_NODAMAGE|MF5_NOFORWARDFALL|MF5_NODROPOFF))
  ;
  uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&iterator.type + 4));
  if (uVar2 != 0) {
    return 0;
  }
  if ((this->special == 0xe5) && (this->args[0] == 0)) {
    FName::FName(&local_6c,NAME_PatrolPoint);
    NActorIterator::NActorIterator((NActorIterator *)local_68,&local_6c,this->args[1]);
    this->special = 0;
    pAVar4 = NActorIterator::Next((NActorIterator *)local_68);
    TObjPtr<AActor>::operator=(&this->goal,pAVar4);
    this->reactiontime = this->args[2] * 0x23 + level.maptime;
    if (this->args[3] == 0) {
      operator~((EnumType)&local_70);
      TFlags<ActorFlag5,_unsigned_int>::operator&=(&this->flags5,&local_70);
    }
    else {
      TFlags<ActorFlag5,_unsigned_int>::operator|=(&this->flags5,MF5_CHASEGOAL);
    }
  }
  this->threshold = 0;
  if (this->TIDtoHate == 0) {
    if ((i_compatflags & 0x800U) == 0) {
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_74,
                 iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                         MF_SHOOTABLE));
      uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_74);
      if (uVar2 != 0) goto LAB_00555d50;
      local_a0 = (TObjPtr *)&this->LastHeard;
    }
    else {
LAB_00555d50:
      local_a0 = (TObjPtr *)&this->Sector->SoundTarget;
    }
    local_48 = TObjPtr::operator_cast_to_AActor_(local_a0);
    if ((local_48 != (AActor *)0x0) && (local_48->health < 1)) {
      local_48 = (AActor *)0x0;
    }
    if (((local_48 != (AActor *)0x0) && (local_48->player != (player_t *)0x0)) &&
       ((local_48->player->cheats & 8U) != 0)) {
      return 0;
    }
  }
  else {
    local_48 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->target);
  }
  TFlags<ActorFlag,_unsigned_int>::operator&
            (&local_78,
             iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                     MF_SHOOTABLE));
  uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_78);
  if (uVar2 != 0) {
    this->visdir = -1;
  }
  bVar5 = false;
  if (local_48 != (AActor *)0x0) {
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_7c,
               (int)local_48 +
               (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_7c);
    bVar5 = uVar2 != 0;
  }
  if (bVar5) {
    bVar5 = AActor::IsFriend(this,local_48);
    if (bVar5) {
      TFlags<ActorFlag4,_unsigned_int>::operator&
                (&local_80,
                 iVar1 + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH));
      uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_80);
      bVar5 = P_LookForPlayers(this,uVar2,(FLookExParams *)0x0);
      if (bVar5) goto LAB_00555fc0;
      if (this->SeeState == (FState *)0x0) {
        A_Wander(this,0);
      }
      else {
        AActor::SetState(this,this->SeeState,false);
      }
    }
    else {
      TObjPtr<AActor>::operator=(&this->target,local_48);
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_84,
                 iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                         MF_SHOOTABLE));
      uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_84);
      if (uVar2 == 0) goto LAB_00555fc0;
      pAVar4 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->target);
      bVar5 = P_CheckSight(this,pAVar4,4);
      if (bVar5) goto LAB_00555fc0;
    }
  }
  TFlags<ActorFlag4,_unsigned_int>::operator&
            (&local_88,iVar1 + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH)
            );
  uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_88);
  bVar5 = P_LookForPlayers(this,uVar2,(FLookExParams *)0x0);
  if (((bVar5 ^ 0xffU) & 1) != 0) {
    return 0;
  }
LAB_00555fc0:
  pAVar4 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->goal);
  bVar5 = TObjPtr<AActor>::operator==(&this->target,pAVar4);
  if (bVar5) {
    if (level.maptime < this->reactiontime) {
      TObjPtr<AActor>::operator=(&this->target,(AActor *)0x0);
    }
  }
  else {
    iVar3 = FSoundID::operator_cast_to_int(&(this->SeeSound).super_FSoundID);
    if (iVar3 != 0) {
      TFlags<ActorFlag2,_unsigned_int>::operator&
                (&local_8c,iVar1 + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
      uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_8c);
      if (uVar2 == 0) {
        FSoundID::FSoundID(&local_94,&(this->SeeSound).super_FSoundID);
        S_Sound(this,2,&local_94,1.0,1.0);
      }
      else {
        FSoundID::FSoundID(&local_90,&(this->SeeSound).super_FSoundID);
        S_Sound(this,2,&local_90,1.0,0.0);
      }
    }
  }
  pAVar4 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->target);
  if (pAVar4 != (AActor *)0x0) {
    AActor::SetState(this,this->SeeState,false);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Look)
{
	PARAM_SELF_PROLOGUE(AActor);

	AActor *targ;

	if (self->flags5 & MF5_INCONVERSATION)
		return 0;

	// [RH] Set goal now if appropriate
	if (self->special == Thing_SetGoal && self->args[0] == 0) 
	{
		NActorIterator iterator (NAME_PatrolPoint, self->args[1]);
		self->special = 0;
		self->goal = iterator.Next ();
		self->reactiontime = self->args[2] * TICRATE + level.maptime;
		if (self->args[3] == 0) self->flags5 &= ~MF5_CHASEGOAL;
		else self->flags5 |= MF5_CHASEGOAL;
	}

	self->threshold = 0;		// any shot will wake up

	if (self->TIDtoHate != 0)
	{
		targ = self->target;
	}
	else
	{
		targ = (i_compatflags & COMPATF_SOUNDTARGET || self->flags & MF_NOSECTOR)? 
			self->Sector->SoundTarget : self->LastHeard;

		// [RH] If the soundtarget is dead, don't chase it
		if (targ != NULL && targ->health <= 0)
		{
			targ = NULL;
		}

		if (targ && targ->player && (targ->player->cheats & CF_NOTARGET))
		{
			return 0;
		}
	}

	// [RH] Andy Baker's stealth monsters
	if (self->flags & MF_STEALTH)
	{
		self->visdir = -1;
	}

	if (targ && (targ->flags & MF_SHOOTABLE))
	{
		if (self->IsFriend (targ))	// be a little more precise!
		{
			// If we find a valid target here, the wandering logic should *not*
			// be activated! It would cause the seestate to be set twice.
			if (P_LookForPlayers (self, self->flags4 & MF4_LOOKALLAROUND, NULL))
				goto seeyou;

			// Let the self wander around aimlessly looking for a fight
			if (self->SeeState != NULL)
			{
				self->SetState (self->SeeState);
			}
			else
			{
				A_Wander(self);
			}
		}
		else
		{
			self->target = targ;

			if (self->flags & MF_AMBUSH)
			{
				if (P_CheckSight (self, self->target, SF_SEEPASTBLOCKEVERYTHING))
					goto seeyou;
			}
			else
				goto seeyou;
		}
	}
	
	if (!P_LookForPlayers (self, self->flags4 & MF4_LOOKALLAROUND, NULL))
		return 0;
				
	// go into chase state
  seeyou:
	// [RH] Don't start chasing after a goal if it isn't time yet.
	if (self->target == self->goal)
	{
		if (self->reactiontime > level.maptime)
			self->target = NULL;
	}
	else if (self->SeeSound)
	{
		if (self->flags2 & MF2_BOSS)
		{ // full volume
			S_Sound (self, CHAN_VOICE, self->SeeSound, 1, ATTN_NONE);
		}
		else
		{
			S_Sound (self, CHAN_VOICE, self->SeeSound, 1, ATTN_NORM);
		}
	}

	if (self->target)
	{
		self->SetState (self->SeeState);
	}
	return 0;
}